

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

void __thiscall
deqp::ub::StructType::addMember(StructType *this,char *name,VarType *type,deUint32 flags)

{
  StructMember local_68;
  deUint32 local_24;
  VarType *pVStack_20;
  deUint32 flags_local;
  VarType *type_local;
  char *name_local;
  StructType *this_local;
  
  local_24 = flags;
  pVStack_20 = type;
  type_local = (VarType *)name;
  name_local = (char *)this;
  StructMember::StructMember(&local_68,name,type,flags);
  std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>::push_back
            (&this->m_members,&local_68);
  StructMember::~StructMember(&local_68);
  return;
}

Assistant:

void StructType::addMember(const char* name, const VarType& type, deUint32 flags)
{
	m_members.push_back(StructMember(name, type, flags));
}